

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O0

void cuddReclaim(DdManager *table,DdNode *n)

{
  uint uVar1;
  int iVar2;
  DdNode **ppDVar3;
  double initialDead;
  int SP;
  DdNodePtr *stack;
  DdNode *pDStack_20;
  int ord;
  DdNode *N;
  DdNode *n_local;
  DdManager *table_local;
  
  ppDVar3 = table->stack;
  initialDead._4_4_ = 1;
  uVar1 = table->dead;
  pDStack_20 = (DdNode *)((ulong)n & 0xfffffffffffffffe);
  do {
    if (pDStack_20->ref == 0) {
      pDStack_20->ref = 1;
      table->dead = table->dead - 1;
      if (pDStack_20->index == 0x7fffffff) {
        (table->constants).dead = (table->constants).dead - 1;
        pDStack_20 = ppDVar3[initialDead._4_4_ + -1];
        initialDead._4_4_ = initialDead._4_4_ + -1;
      }
      else {
        iVar2 = table->perm[pDStack_20->index];
        ppDVar3[initialDead._4_4_] =
             (DdNode *)((ulong)(pDStack_20->type).kids.E & 0xfffffffffffffffe);
        table->subtables[iVar2].dead = table->subtables[iVar2].dead - 1;
        pDStack_20 = (pDStack_20->type).kids.T;
        initialDead._4_4_ = initialDead._4_4_ + 1;
      }
    }
    else {
      pDStack_20->ref = pDStack_20->ref + 1;
      pDStack_20 = ppDVar3[initialDead._4_4_ + -1];
      initialDead._4_4_ = initialDead._4_4_ + -1;
    }
  } while (initialDead._4_4_ != 0);
  *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) = *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + -1
  ;
  table->reclaimed = ((double)uVar1 - (double)table->dead) + table->reclaimed;
  return;
}

Assistant:

void
cuddReclaim(
  DdManager * table,
  DdNode * n)
{
    DdNode *N;
    int ord;
    DdNodePtr *stack = table->stack;
    int SP = 1;
    double initialDead = table->dead;

    N = Cudd_Regular(n);

#ifdef DD_DEBUG
    assert(N->ref == 0);
#endif

    do {
        if (N->ref == 0) {
            N->ref = 1;
            table->dead--;
            if (cuddIsConstant(N)) {
                table->constants.dead--;
                N = stack[--SP];
            } else {
                ord = table->perm[N->index];
                stack[SP++] = Cudd_Regular(cuddE(N));
                table->subtables[ord].dead--;
                N = cuddT(N);
            }
        } else {
            cuddSatInc(N->ref);
            N = stack[--SP];
        }
    } while (SP != 0);

    N = Cudd_Regular(n);
    cuddSatDec(N->ref);
    table->reclaimed += initialDead - table->dead;

}